

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cxx
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  option *poVar3;
  option *poVar4;
  option *poVar5;
  option *poVar6;
  option *poVar7;
  option *poVar8;
  option *poVar9;
  undefined *puVar10;
  level_tools *this;
  clock_t cVar11;
  clock_t cVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  size_t sVar16;
  cl_parser cl;
  char *fs_spec;
  cl_parser local_88;
  string local_68;
  option *local_48;
  option *local_40;
  option *local_38;
  
  cl_parser::cl_parser(&local_88);
  bVar1 = cl_parser::parse(&local_88,argc,argv,0x25,main::options);
  if (!bVar1) {
    usage();
    iVar2 = 1;
    goto LAB_0011f92e;
  }
  local_38 = cl_parser::find_option(&local_88,"-ogf");
  local_40 = cl_parser::find_option(&local_88,"-omf");
  local_48 = cl_parser::find_option(&local_88,"-dm");
  poVar3 = cl_parser::find_option(&local_88,"-level");
  poVar4 = cl_parser::find_option(&local_88,"-ogg2wav");
  poVar5 = cl_parser::find_option(&local_88,"-dds2tga");
  poVar6 = cl_parser::find_option(&local_88,"-unpack");
  poVar7 = cl_parser::find_option(&local_88,"-pack");
  poVar8 = cl_parser::find_option(&local_88,"-fancy");
  poVar9 = cl_parser::find_option(&local_88,"-xrdemo");
  uVar14 = (local_38 != (option *)0x0) + 2;
  if (local_40 == (option *)0x0) {
    uVar14 = (uint)(local_38 != (option *)0x0);
  }
  uVar13 = uVar14 + 4;
  if (local_48 == (option *)0x0) {
    uVar13 = uVar14;
  }
  uVar14 = uVar13 + 8;
  if (poVar3 == (option *)0x0) {
    uVar14 = uVar13;
  }
  uVar13 = uVar14 | 0x10;
  if (poVar4 == (option *)0x0) {
    uVar13 = uVar14;
  }
  uVar14 = uVar13 | 0x20;
  if (poVar5 == (option *)0x0) {
    uVar14 = uVar13;
  }
  uVar13 = uVar14 | 0x40;
  if (poVar6 == (option *)0x0) {
    uVar13 = uVar14;
  }
  uVar14 = uVar13 | 0x80;
  if (poVar7 == (option *)0x0) {
    uVar14 = uVar13;
  }
  uVar13 = uVar14 | 0x100;
  if (poVar8 == (option *)0x0) {
    uVar13 = uVar14;
  }
  uVar14 = uVar13 | 0x200;
  if (poVar9 == (option *)0x0) {
    uVar14 = uVar13;
  }
  if (uVar14 == 0) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    local_68._M_string_length = 0;
    local_68.field_2._M_local_buf[0] = '\0';
    if (local_88.m_num_params == 0) {
      usage();
LAB_0011f53a:
      uVar14 = 0;
      iVar2 = 1;
      bVar1 = true;
    }
    else {
      uVar14 = 0;
      lVar15 = -0x18;
      sVar16 = local_88.m_num_params;
      do {
        bVar1 = xray_re::xr_file_system::folder_exist
                          (*(char **)((long)&local_88.m_options[local_88.m_argc].name + lVar15));
        if (bVar1) {
          uVar14 = uVar14 | 0x80;
        }
        else {
          xray_re::xr_file_system::split_path
                    (*(char **)((long)&local_88.m_options[local_88.m_argc].name + lVar15),
                     (string *)0x0,(string *)0x0,&local_68);
          iVar2 = std::__cxx11::string::compare((char *)&local_68);
          if (iVar2 == 0) {
            uVar14 = uVar14 | 1;
          }
          else {
            iVar2 = std::__cxx11::string::compare((char *)&local_68);
            if (iVar2 == 0) {
              uVar14 = uVar14 | 2;
            }
            else {
              iVar2 = std::__cxx11::string::compare((char *)&local_68);
              if (iVar2 == 0) {
                uVar14 = uVar14 | 4;
              }
              else {
                iVar2 = std::__cxx11::string::compare((char *)&local_68);
                if (iVar2 == 0) {
                  uVar14 = uVar14 | 0x200;
                }
                else {
                  bVar1 = db_tools::is_known(&local_68);
                  if (bVar1) {
                    uVar14 = uVar14 | 0x40;
                  }
                }
              }
            }
          }
        }
        lVar15 = lVar15 + -0x18;
        sVar16 = sVar16 - 1;
      } while (sVar16 != 0);
      bVar1 = false;
      iVar2 = 0;
      if (uVar14 == 0) {
        xray_re::msg("can\'t auto-detect the source format");
        goto LAB_0011f53a;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                               local_68.field_2._M_local_buf[0]) + 1);
    }
    if (bVar1) goto LAB_0011f92e;
  }
  if ((uVar14 & uVar14 - 1) != 0) {
    iVar2 = 1;
    xray_re::msg("conflicting source formats");
    goto LAB_0011f92e;
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  if (((uVar14 < 0x21) && ((0x100010100U >> ((ulong)uVar14 & 0x3f) & 1) != 0)) || (uVar14 == 0x100))
  {
    bVar1 = cl_parser::get_string(&local_88,"-fs",(char **)&local_68);
    if (!bVar1) {
      local_68._M_dataplus._M_p = "fsconverter.ltx";
    }
    bVar1 = xray_re::xr_file_system::file_exist(local_68._M_dataplus._M_p);
    if (!bVar1) {
      iVar2 = 1;
      xray_re::msg("can\'t find %s",local_68._M_dataplus._M_p);
      goto LAB_0011f92e;
    }
  }
  bVar1 = cl_parser::get_bool(&local_88,"-ro");
  if (bVar1) {
    xray_re::msg("working in read-only mode");
  }
  if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
     (iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar2 != 0)) {
    xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
    __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                 &xray_re::xr_file_system::instance::instance0,&__dso_handle);
    __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
  }
  bVar1 = xray_re::xr_file_system::initialize
                    (&xray_re::xr_file_system::instance::instance0,local_68._M_dataplus._M_p,
                     (uint)bVar1);
  if (!bVar1) {
    iVar2 = 1;
    xray_re::msg("can\'t initialize the file system");
    goto LAB_0011f92e;
  }
  if (xray_re::xr_log::instance()::instance0 == '\0') {
    main_cold_1();
  }
  xray_re::xr_log::init
            ((xr_log *)xray_re::xr_log::instance()::instance0,(EVP_PKEY_CTX *)"converter");
  if (0x1f < uVar14) {
    if (uVar14 < 0x80) {
      if (uVar14 == 0x20) {
        this = (level_tools *)operator_new(0x30);
        dds_tools::dds_tools((dds_tools *)this);
      }
      else {
        if (uVar14 != 0x40) goto switchD_0011f673_caseD_2;
        this = (level_tools *)operator_new(8);
        (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__tools_base_00246070;
      }
    }
    else if (uVar14 == 0x80) {
      this = (level_tools *)operator_new(0x60);
      (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__db_packer_00246030;
      *(char ***)&this->m_rmode = &this->m_sect_profile;
      this->m_ini = (xr_ini_file *)0x0;
      *(undefined1 *)&this->m_sect_profile = 0;
      this->m_sect_wallmark_shaders = (char *)0x0;
      this->m_debug_texture = (char *)0x0;
      this->m_fake_gamemtl = (char *)0x0;
      this->m_ladders_gamemtl = (char *)0x0;
      this->m_ghost_eshader = (char *)0x0;
      this->m_shaders_xrlc_lib = (xr_shaders_xrlc_lib *)0x0;
    }
    else {
      if (uVar14 != 0x100) {
        if (uVar14 != 0x200) goto switchD_0011f673_caseD_2;
        this = (level_tools *)operator_new(0x50);
        *(char ***)&this->m_rmode = &this->m_sect_profile;
        this->m_ini = (xr_ini_file *)0x0;
        *(undefined1 *)&this->m_sect_profile = 0;
        this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
        this->m_debug_texture = (char *)0x0;
        *(undefined1 *)&this->m_fake_gamemtl = 0;
        puVar10 = &xrdemo_tools::vtable;
        goto LAB_0011f83a;
      }
      this = (level_tools *)operator_new(0x10);
      (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__fancy_tools_002461b0;
      (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)0x0;
    }
    goto LAB_0011f8e9;
  }
  switch(uVar14 - 1) {
  case 0:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar10 = &ogf_tools::vtable;
    break;
  case 1:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar10 = &omf_tools::vtable;
    break;
  case 2:
  case 4:
  case 5:
  case 6:
switchD_0011f673_caseD_2:
    iVar2 = 0;
    xray_re::msg("locked");
    goto LAB_0011f92e;
  case 3:
    this = (level_tools *)operator_new(0x50);
    *(char ***)&this->m_rmode = &this->m_sect_profile;
    this->m_ini = (xr_ini_file *)0x0;
    *(undefined1 *)&this->m_sect_profile = 0;
    this->m_sect_wallmark_shaders = (char *)&this->m_fake_gamemtl;
    this->m_debug_texture = (char *)0x0;
    *(undefined1 *)&this->m_fake_gamemtl = 0;
    puVar10 = &dm_tools::vtable;
    break;
  case 7:
    this = (level_tools *)operator_new(0x140);
    level_tools::level_tools(this);
    goto LAB_0011f8e9;
  default:
    if (uVar14 != 0x10) goto switchD_0011f673_caseD_2;
    this = (level_tools *)operator_new(0x28);
    (this->super_tools_base)._vptr_tools_base = (_func_int **)&PTR__ogg_tools_00246750;
    (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)&this->m_ini;
    this->m_rmode = 0;
    this->m_rflags = 0;
    *(undefined1 *)&this->m_ini = 0;
    goto LAB_0011f8e9;
  }
LAB_0011f83a:
  (this->super_tools_base)._vptr_tools_base = (_func_int **)(puVar10 + 0x10);
  (this->super_xr_surface_factory)._vptr_xr_surface_factory = (_func_int **)(puVar10 + 0x38);
LAB_0011f8e9:
  cVar11 = clock();
  (*(this->super_tools_base)._vptr_tools_base[2])(this,&local_88);
  cVar12 = clock();
  xray_re::msg("total time: %.3lfs",SUB84((double)(cVar12 - cVar11) / 1000000.0,0));
  (*(this->super_tools_base)._vptr_tools_base[1])(this);
  iVar2 = 0;
LAB_0011f92e:
  cl_parser::~cl_parser(&local_88);
  return iVar2;
}

Assistant:

int main(int argc, char* argv[])
{
	static const cl_parser::option_desc options[] = {
		{"-ogf",	cl_parser::OT_BOOL},
		{"-omf",	cl_parser::OT_BOOL},
		{"-dm",		cl_parser::OT_BOOL},
		{"-level",	cl_parser::OT_BOOL},
		{"-ogg2wav",	cl_parser::OT_BOOL},
		{"-dds2tga",	cl_parser::OT_BOOL},
		{"-unpack",	cl_parser::OT_BOOL},
		{"-pack",	cl_parser::OT_BOOL},
		{"-xrdemo",	cl_parser::OT_BOOL},

		{"-11xx",	cl_parser::OT_BOOL},
		{"-2215",	cl_parser::OT_BOOL},
		{"-2945",	cl_parser::OT_BOOL},
		{"-2947ru",	cl_parser::OT_BOOL},
		{"-2947ww",	cl_parser::OT_BOOL},
		{"-xdb",	cl_parser::OT_BOOL},
		{"-xdb_ud",	cl_parser::OT_STRING},

		{"-info",	cl_parser::OT_BOOL},
		{"-skl",	cl_parser::OT_STRING},
		{"-skls",	cl_parser::OT_BOOL},
		{"-bones",	cl_parser::OT_BOOL},
		{"-comment",	cl_parser::OT_BOOL},
		{"-object",	cl_parser::OT_BOOL},
		{"-sg",		cl_parser::OT_STRING},

		{"-fs",		cl_parser::OT_STRING},
		{"-out",	cl_parser::OT_STRING},
		{"-dir",	cl_parser::OT_STRING},
		{"-flt",	cl_parser::OT_STRING},

		{"-ro",		cl_parser::OT_BOOL},

		{"-with_solid",	cl_parser::OT_BOOL},
		{"-with_bump",	cl_parser::OT_BOOL},

		{"-mode",	cl_parser::OT_STRING},
		{"-with_lods",	cl_parser::OT_BOOL},
		{"-dbgcfrm",	cl_parser::OT_BOOL},
		{"-dbgmrg",	cl_parser::OT_BOOL},
		{"-use_mt",	cl_parser::OT_BOOL},
		{"-terrain", cl_parser::OT_BOOL},

		{"-fancy",	cl_parser::OT_STRING},
	};

	cl_parser cl;
	if (!cl.parse(argc, argv, xr_dim(options), options)) {
		usage();
		return 1;
	}

	unsigned format = tools_base::TOOLS_AUTO;
	if (cl.exist("-ogf"))
		format |= tools_base::TOOLS_OGF;
	if (cl.exist("-omf"))
		format |= tools_base::TOOLS_OMF;
	if (cl.exist("-dm"))
		format |= tools_base::TOOLS_DM;
	if (cl.exist("-level"))
		format |= tools_base::TOOLS_LEVEL;
	if (cl.exist("-ogg2wav"))
		format |= tools_base::TOOLS_OGG;
	if (cl.exist("-dds2tga"))
		format |= tools_base::TOOLS_DDS;
	if (cl.exist("-unpack"))
		format |= tools_base::TOOLS_DB;
	if (cl.exist("-pack"))
		format |= tools_base::TOOLS_FOLDER;
	if (cl.exist("-fancy"))
		format |= tools_base::TOOLS_FANCY;
	if (cl.exist("-xrdemo"))
		format |= tools_base::TOOLS_XRDEMO;
	if (format == tools_base::TOOLS_AUTO) {
		std::string extension;
		size_t num_params = cl.num_params();
		for (size_t i = 0; i != num_params; ++i) {
			if (xr_file_system::folder_exist(cl.param(i))) {
				format |= tools_base::TOOLS_FOLDER;
			} else {
				xr_file_system::split_path(cl.param(i), 0, 0, &extension);
				if (extension == ".ogf")
					format |= tools_base::TOOLS_OGF;
				else if (extension == ".omf")
					format |= tools_base::TOOLS_OMF;
				else if (extension == ".dm")
					format |= tools_base::TOOLS_DM;
				else if (extension == ".xrdemo")
					format |= tools_base::TOOLS_XRDEMO;
				else if (db_tools::is_known(extension))
					format |= tools_base::TOOLS_DB;
			}
		}
		if (format == tools_base::TOOLS_AUTO) {
			if (num_params)
				msg("can't auto-detect the source format");
			else
				usage();
			return 1;
		}
	}
	if ((format & (format - 1)) != 0) {
		msg("conflicting source formats");
		return 1;
	}

	const char* fs_spec = 0;
	if (format == tools_base::TOOLS_LEVEL ||
			format == tools_base::TOOLS_DDS ||
			format == tools_base::TOOLS_FANCY ||
			format == tools_base::TOOLS_OGG) {
		if (!cl.get_string("-fs", fs_spec))
			fs_spec = DEFAULT_FS_SPEC;
		if (!xr_file_system::file_exist(fs_spec)) {
			msg("can't find %s", fs_spec);
			return 1;
		}
	}
	unsigned fs_flags = 0;
	if (cl.get_bool("-ro")) {
		fs_flags |= xr_file_system::FSF_READ_ONLY;
		msg("working in read-only mode");
	}
	xr_file_system& fs = xr_file_system::instance();
	if (!fs.initialize(fs_spec, fs_flags)) {
		msg("can't initialize the file system");
		return 1;
	}
	xr_log::instance().init("converter", 0);

	tools_base* tools = 0;
	switch (format) {
	case tools_base::TOOLS_OGF:
		tools = new ogf_tools;
		break;
	case tools_base::TOOLS_OMF:
		tools = new omf_tools;
		break;
	case tools_base::TOOLS_DM:
		tools = new dm_tools;
		break;
	case tools_base::TOOLS_LEVEL:
		tools = new level_tools;
		break;
	case tools_base::TOOLS_OGG:
		tools = new ogg_tools;
		break;
	case tools_base::TOOLS_DDS:
		tools = new dds_tools;
		break;
	case tools_base::TOOLS_DB:
		tools = new db_unpacker;
		break;
	case tools_base::TOOLS_FOLDER:
		tools = new db_packer;
		break;
	case tools_base::TOOLS_FANCY:
		tools = new fancy_tools;
		break;
	case tools_base::TOOLS_XRDEMO:
		tools = new xrdemo_tools;
		break;
	}
	if (tools == 0) {
		msg("locked");
		return 0;
	}

	clock_t start = clock();
	tools->process(cl);
	msg("total time: %.3lfs", (clock() - start) / 1.0 / CLOCKS_PER_SEC);

	delete tools;
	return 0;
}